

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_inc.h
# Opt level: O2

void CreateBackwardReferencesNH54
               (size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
               BrotliEncoderParams *params,HasherHandle hasher,int *dist_cache,
               size_t *last_insert_len,Command *commands,size_t *num_commands,size_t *num_literals)

{
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  int iVar4;
  ushort uVar5;
  size_t sVar6;
  uint8_t uVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  byte bVar14;
  int iVar15;
  long lVar16;
  ulong uVar17;
  uint32_t uVar18;
  ulong uVar19;
  int iVar20;
  ulong uVar21;
  uint *puVar22;
  uint16_t uVar23;
  uint uVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  int iVar29;
  uint32_t uVar30;
  uint uVar31;
  ulong uVar32;
  size_t sVar33;
  ulong uVar34;
  bool bVar35;
  ulong local_100;
  ulong local_f8;
  ulong local_e8;
  ulong local_e0;
  ulong local_d8;
  size_t local_d0;
  Command *local_c8;
  ulong local_a0;
  uint local_68;
  
  uVar32 = (1L << ((byte)params->lgwin & 0x3f)) - 0x10;
  uVar3 = (position - 7) + num_bytes;
  sVar33 = position;
  if (7 < num_bytes) {
    sVar33 = uVar3;
  }
  lVar16 = 0x200;
  if (params->quality < 9) {
    lVar16 = 0x40;
  }
  uVar1 = position + num_bytes;
  lVar2 = position + num_bytes;
  local_d0 = *last_insert_len;
  uVar12 = lVar16 + position;
  local_c8 = commands;
  do {
LAB_00109de4:
    uVar26 = position;
    if (uVar1 <= uVar26 + 8) {
      *last_insert_len = (local_d0 + uVar1) - uVar26;
      *num_commands = *num_commands + ((long)local_c8 - (long)commands >> 4);
      return;
    }
    local_a0 = uVar1 - uVar26;
    uVar13 = uVar32;
    if (uVar26 < uVar32) {
      uVar13 = uVar26;
    }
    uVar10 = uVar26 & ringbuffer_mask;
    local_e0 = (ulong)*dist_cache;
    local_68 = (uint)ringbuffer_mask;
    uVar7 = (uint8_t)*(long *)(ringbuffer + uVar10);
    if ((uVar26 - local_e0 < uVar26) &&
       (uVar21 = (ulong)((uint)(uVar26 - local_e0) & local_68), ringbuffer[uVar21] == uVar7)) {
      uVar19 = local_a0 & 0xfffffffffffffff8;
      uVar25 = 0;
      lVar11 = 0;
LAB_00109e4b:
      if (local_a0 >> 3 == uVar25) {
        uVar34 = (ulong)((uint)local_a0 & 7);
        for (; (bVar35 = uVar34 != 0, uVar34 = uVar34 - 1, uVar25 = local_a0, bVar35 &&
               (uVar25 = uVar19, ringbuffer[uVar19 + uVar21] == ringbuffer[uVar19 + uVar10]));
            uVar19 = uVar19 + 1) {
        }
      }
      else {
        if (*(ulong *)(ringbuffer + uVar25 * 8 + uVar10) ==
            *(ulong *)(ringbuffer + uVar25 * 8 + uVar21)) break;
        uVar19 = *(ulong *)(ringbuffer + uVar25 * 8 + uVar21) ^
                 *(ulong *)(ringbuffer + uVar25 * 8 + uVar10);
        uVar21 = 0;
        if (uVar19 != 0) {
          for (; (uVar19 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
          }
        }
        uVar25 = (uVar21 >> 3 & 0x1fffffff) - lVar11;
      }
      if ((uVar25 < 4) || (local_f8 = uVar25 * 0x87 + 0x78f, local_f8 < 0x7e5)) goto LAB_00109eb1;
      uVar7 = ringbuffer[uVar25 + uVar10];
    }
    else {
LAB_00109eb1:
      local_f8 = 0x7e4;
      local_e0 = 0;
      uVar25 = 0;
    }
    uVar21 = *(long *)(ringbuffer + uVar10) * 0x35a7bd1e35a7bd00;
    puVar22 = (uint *)(hasher + (uVar21 >> 0x2c) * 4 + 0x28);
    for (iVar29 = 0; iVar29 != 4; iVar29 = iVar29 + 1) {
      uVar9 = *puVar22;
      uVar8 = local_68 & uVar9;
      if (((uVar7 == ringbuffer[uVar25 + uVar8]) && (uVar26 != uVar9)) &&
         (uVar19 = uVar26 - uVar9, uVar19 <= uVar13)) {
        uVar34 = 0;
        lVar11 = 0;
LAB_00109f3c:
        uVar27 = (ulong)((uint)local_a0 & 7);
        uVar17 = local_a0 & 0xfffffffffffffff8;
        if (local_a0 >> 3 == uVar34) {
          for (; (uVar34 = local_a0, uVar27 != 0 &&
                 (uVar34 = uVar17, ringbuffer[uVar17 + uVar8] == ringbuffer[uVar17 + uVar10]));
              uVar17 = uVar17 + 1) {
            uVar27 = uVar27 - 1;
          }
        }
        else {
          if (*(ulong *)(ringbuffer + uVar34 * 8 + uVar10) ==
              *(ulong *)(ringbuffer + uVar34 * 8 + (ulong)uVar8)) goto code_r0x00109f4e;
          uVar27 = *(ulong *)(ringbuffer + uVar34 * 8 + (ulong)uVar8) ^
                   *(ulong *)(ringbuffer + uVar34 * 8 + uVar10);
          uVar34 = 0;
          if (uVar27 != 0) {
            for (; (uVar27 >> uVar34 & 1) == 0; uVar34 = uVar34 + 1) {
            }
          }
          uVar34 = (uVar34 >> 3 & 0x1fffffff) - lVar11;
        }
        if (3 < uVar34) {
          iVar15 = 0x1f;
          if ((uint)uVar19 != 0) {
            for (; (uint)uVar19 >> iVar15 == 0; iVar15 = iVar15 + -1) {
            }
          }
          uVar27 = (ulong)(iVar15 * -0x1e + 0x780) + uVar34 * 0x87;
          if (local_f8 < uVar27) {
            uVar7 = ringbuffer[uVar34 + uVar10];
            uVar25 = uVar34;
            local_f8 = uVar27;
            local_e0 = uVar19;
          }
        }
      }
      puVar22 = puVar22 + 1;
    }
    *(int *)(hasher + (ulong)((uint)(uVar21 >> 0x2c) + ((uint)(uVar26 >> 3) & 3)) * 4 + 0x28) =
         (int)uVar26;
    if (local_f8 < 0x7e5) {
      local_d0 = local_d0 + 1;
      position = uVar26 + 1;
      if (uVar12 < position) {
        if ((uint)((int)lVar16 * 4) + uVar12 < position) {
          uVar13 = uVar26 + 0x11;
          if (uVar3 <= uVar26 + 0x11) {
            uVar13 = uVar3;
          }
          for (; position < uVar13; position = position + 4) {
            *(int *)(hasher + (ulong)((uint)((ulong)(*(long *)(ringbuffer +
                                                              (position & ringbuffer_mask)) *
                                                    0x35a7bd1e35a7bd00) >> 0x2c) +
                                     ((uint)(position >> 3) & 3)) * 4 + 0x28) = (int)position;
            local_d0 = local_d0 + 4;
          }
        }
        else {
          uVar13 = uVar26 + 9;
          if (uVar3 <= uVar26 + 9) {
            uVar13 = uVar3;
          }
          for (; position < uVar13; position = position + 2) {
            *(int *)(hasher + (ulong)((uint)((ulong)(*(long *)(ringbuffer +
                                                              (position & ringbuffer_mask)) *
                                                    0x35a7bd1e35a7bd00) >> 0x2c) +
                                     ((uint)(position >> 3) & 3)) * 4 + 0x28) = (int)position;
            local_d0 = local_d0 + 2;
          }
        }
      }
      goto LAB_00109de4;
    }
    iVar29 = *dist_cache;
    uVar12 = local_d0 + 4;
    uVar13 = (lVar2 + -1) - uVar26;
    iVar15 = 0;
    do {
      uVar21 = (ulong)((uint)uVar13 & 7);
      local_a0 = local_a0 - 1;
      uVar10 = uVar25 - 1;
      if (local_a0 <= uVar25 - 1) {
        uVar10 = local_a0;
      }
      if (4 < params->quality) {
        uVar10 = 0;
      }
      uVar19 = uVar26 + 1;
      local_d8 = uVar32;
      if (uVar19 < uVar32) {
        local_d8 = uVar19;
      }
      uVar27 = uVar19 & ringbuffer_mask;
      uVar7 = ringbuffer[uVar10 + uVar27];
      uVar34 = uVar19 - (long)iVar29;
      local_e8 = 0x7e4;
      if ((uVar34 < uVar19) &&
         (uVar9 = (uint)uVar34 & local_68, uVar7 == ringbuffer[uVar10 + uVar9])) {
        uVar34 = 0;
        lVar11 = 0;
LAB_0010a197:
        if (uVar13 >> 3 == uVar34) {
          uVar17 = uVar21;
          for (uVar34 = -lVar11;
              (bVar35 = uVar17 != 0, uVar17 = uVar17 - 1, bVar35 &&
              (ringbuffer[uVar34 + uVar9] == ringbuffer[uVar34 + uVar27])); uVar34 = uVar34 + 1) {
          }
        }
        else {
          if (*(ulong *)(ringbuffer + uVar34 * 8 + uVar27) ==
              *(ulong *)(ringbuffer + uVar34 * 8 + (ulong)uVar9)) goto code_r0x0010a1af;
          uVar17 = *(ulong *)(ringbuffer + uVar34 * 8 + (ulong)uVar9) ^
                   *(ulong *)(ringbuffer + uVar34 * 8 + uVar27);
          uVar34 = 0;
          if (uVar17 != 0) {
            for (; (uVar17 >> uVar34 & 1) == 0; uVar34 = uVar34 + 1) {
            }
          }
          uVar34 = (uVar34 >> 3 & 0x1fffffff) - lVar11;
        }
        if ((uVar34 < 4) || (uVar17 = uVar34 * 0x87 + 0x78f, uVar17 < 0x7e5)) goto LAB_0010a1f8;
        uVar7 = ringbuffer[uVar34 + uVar27];
        uVar10 = uVar34;
        local_100 = (long)iVar29;
        local_e8 = uVar17;
      }
      else {
LAB_0010a1f8:
        local_100 = 0;
      }
      puVar22 = (uint *)(hasher + ((ulong)(*(long *)(ringbuffer + uVar27) * 0x35a7bd1e35a7bd00) >>
                                  0x2c) * 4 + 0x28);
      for (iVar20 = 0; iVar20 != 4; iVar20 = iVar20 + 1) {
        uVar9 = *puVar22;
        uVar8 = local_68 & uVar9;
        if (((uVar7 == ringbuffer[uVar10 + uVar8]) && (uVar19 != uVar9)) &&
           (uVar34 = uVar19 - uVar9, uVar34 <= local_d8)) {
          uVar17 = 0;
          lVar11 = 0;
LAB_0010a265:
          if (uVar13 >> 3 == uVar17) {
            uVar28 = uVar21;
            for (uVar17 = -lVar11;
                (bVar35 = uVar28 != 0, uVar28 = uVar28 - 1, bVar35 &&
                (ringbuffer[uVar17 + uVar8] == ringbuffer[uVar17 + uVar27])); uVar17 = uVar17 + 1) {
            }
          }
          else {
            if (*(ulong *)(ringbuffer + uVar17 * 8 + uVar27) ==
                *(ulong *)(ringbuffer + uVar17 * 8 + (ulong)uVar8)) goto code_r0x0010a279;
            uVar28 = *(ulong *)(ringbuffer + uVar17 * 8 + (ulong)uVar8) ^
                     *(ulong *)(ringbuffer + uVar17 * 8 + uVar27);
            uVar17 = 0;
            if (uVar28 != 0) {
              for (; (uVar28 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
              }
            }
            uVar17 = (uVar17 >> 3 & 0x1fffffff) - lVar11;
          }
          if (3 < uVar17) {
            iVar4 = 0x1f;
            if ((uint)uVar34 != 0) {
              for (; (uint)uVar34 >> iVar4 == 0; iVar4 = iVar4 + -1) {
              }
            }
            uVar28 = (ulong)(iVar4 * -0x1e + 0x780) + uVar17 * 0x87;
            if (local_e8 < uVar28) {
              uVar7 = ringbuffer[uVar17 + uVar27];
              uVar10 = uVar17;
              local_100 = uVar34;
              local_e8 = uVar28;
            }
          }
        }
        puVar22 = puVar22 + 1;
      }
      *(int *)(hasher + (ulong)((uint)((ulong)(*(long *)(ringbuffer + uVar27) * 0x35a7bd1e35a7bd00)
                                      >> 0x2c) + ((uint)(uVar19 >> 3) & 3)) * 4 + 0x28) =
           (int)uVar19;
      if (local_e8 < local_f8 + 0xaf) {
        uVar10 = uVar25;
        uVar19 = uVar26;
        local_d8 = uVar32;
        sVar6 = local_d0;
        if (uVar26 < uVar32) {
          local_d8 = uVar26;
        }
        break;
      }
      local_e0 = local_100;
      sVar6 = uVar12;
      if (iVar15 == 3) break;
      local_d0 = local_d0 + 1;
      iVar15 = iVar15 + 1;
      uVar21 = uVar26 + 9;
      uVar13 = uVar13 - 1;
      local_f8 = local_e8;
      uVar25 = uVar10;
      uVar26 = uVar19;
      sVar6 = local_d0;
    } while (uVar21 < uVar1);
    local_d0 = sVar6;
    if (local_d8 < local_e0) {
LAB_0010a3fa:
      uVar12 = local_e0 + 0xf;
LAB_0010a3fe:
      if ((local_e0 <= local_d8) && (uVar12 != 0)) {
        dist_cache[3] = dist_cache[2];
        *(undefined8 *)(dist_cache + 1) = *(undefined8 *)dist_cache;
        *dist_cache = (int)local_e0;
      }
    }
    else {
      if (local_e0 != (long)*dist_cache) {
        uVar12 = 1;
        if (local_e0 != (long)dist_cache[1]) {
          uVar12 = (local_e0 + 3) - (long)*dist_cache;
          if (uVar12 < 7) {
            bVar14 = (byte)((int)uVar12 << 2);
            uVar9 = 0x9750468;
          }
          else {
            uVar12 = (local_e0 + 3) - (long)dist_cache[1];
            if (6 < uVar12) {
              uVar12 = 2;
              if ((local_e0 != (long)dist_cache[2]) && (uVar12 = 3, local_e0 != (long)dist_cache[3])
                 ) goto LAB_0010a3fa;
              goto LAB_0010a3fe;
            }
            bVar14 = (byte)((int)uVar12 << 2);
            uVar9 = 0xfdb1ace;
          }
          uVar12 = (ulong)(uVar9 >> (bVar14 & 0x1f) & 0xf);
        }
        goto LAB_0010a3fe;
      }
      uVar12 = 0;
    }
    uVar9 = (uint)local_d0;
    local_c8->insert_len_ = uVar9;
    uVar18 = (uint32_t)uVar10;
    local_c8->copy_len_ = uVar18;
    uVar13 = (ulong)(params->dist).num_direct_distance_codes;
    uVar26 = uVar13 + 0x10;
    uVar30 = 0;
    if (uVar26 <= uVar12) {
      uVar8 = (params->dist).distance_postfix_bits;
      bVar14 = (byte)uVar8;
      uVar13 = ((uVar12 - uVar13) + (4L << (bVar14 & 0x3f))) - 0x10;
      uVar24 = 0x1f;
      uVar31 = (uint)uVar13;
      if (uVar31 != 0) {
        for (; uVar31 >> uVar24 == 0; uVar24 = uVar24 - 1) {
        }
      }
      uVar24 = (uVar24 ^ 0xffffffe0) + 0x1f;
      uVar21 = (ulong)((uVar13 >> ((ulong)uVar24 & 0x3f) & 1) != 0);
      lVar11 = (ulong)uVar24 - (ulong)uVar8;
      uVar12 = (~(-1 << (bVar14 & 0x1f)) & uVar31) + uVar26 +
               (uVar21 + lVar11 * 2 + 0xfffe << (bVar14 & 0x3f)) | lVar11 * 0x400;
      uVar30 = (uint32_t)(uVar13 - (uVar21 + 2 << ((byte)uVar24 & 0x3f)) >> (bVar14 & 0x3f));
    }
    local_c8->dist_prefix_ = (uint16_t)uVar12;
    local_c8->dist_extra_ = uVar30;
    if (5 < local_d0) {
      if (local_d0 < 0x82) {
        uVar9 = 0x1f;
        uVar8 = (uint)(local_d0 - 2);
        if (uVar8 != 0) {
          for (; uVar8 >> uVar9 == 0; uVar9 = uVar9 - 1) {
          }
        }
        uVar9 = (int)(local_d0 - 2 >> ((char)(uVar9 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                (uVar9 ^ 0xffffffe0) * 2 + 0x40;
      }
      else if (local_d0 < 0x842) {
        uVar8 = 0x1f;
        if (uVar9 - 0x42 != 0) {
          for (; uVar9 - 0x42 >> uVar8 == 0; uVar8 = uVar8 - 1) {
          }
        }
        uVar9 = (uVar8 ^ 0xffe0) + 0x2a;
      }
      else {
        uVar9 = 0x15;
        if (0x1841 < local_d0) {
          uVar9 = (uint)(ushort)(0x17 - (local_d0 < 0x5842));
        }
      }
    }
    uVar26 = (ulong)(int)uVar18;
    if (uVar26 < 10) {
      uVar8 = uVar18 - 2;
    }
    else if (uVar26 < 0x86) {
      uVar8 = 0x1f;
      uVar24 = (uint)(uVar26 - 6);
      if (uVar24 != 0) {
        for (; uVar24 >> uVar8 == 0; uVar8 = uVar8 - 1) {
        }
      }
      uVar8 = (int)(uVar26 - 6 >> ((char)(uVar8 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
              (uVar8 ^ 0xffffffe0) * 2 + 0x42;
    }
    else {
      uVar8 = 0x17;
      if (uVar26 < 0x846) {
        uVar8 = 0x1f;
        if (uVar18 - 0x46 != 0) {
          for (; uVar18 - 0x46 >> uVar8 == 0; uVar8 = uVar8 - 1) {
          }
        }
        uVar8 = (uVar8 ^ 0xffe0) + 0x2c;
      }
    }
    uVar5 = (ushort)uVar8;
    uVar23 = (uVar5 & 7) + ((ushort)uVar9 & 7) * 8;
    if ((((uVar12 & 0x3ff) == 0) && ((ushort)uVar9 < 8)) && (uVar5 < 0x10)) {
      if (7 < uVar5) {
        uVar23 = uVar23 + 0x40;
      }
    }
    else {
      iVar29 = ((uVar9 & 0xffff) >> 3) * 3 + ((uVar8 & 0xffff) >> 3);
      uVar23 = uVar23 + ((ushort)(0x520d40 >> ((char)iVar29 * '\x02' & 0x1fU)) & 0xc0) +
                        (short)iVar29 * 0x40 + 0x40;
    }
    local_c8->cmd_prefix_ = uVar23;
    *num_literals = *num_literals + local_d0;
    position = uVar10 + uVar19;
    uVar26 = sVar33;
    if (position < sVar33) {
      uVar26 = position;
    }
    uVar13 = uVar19 + 2;
    if (local_e0 < uVar10 >> 2) {
      uVar12 = position + local_e0 * -4;
      if (uVar12 < uVar13) {
        uVar12 = uVar13;
      }
      uVar13 = uVar12;
      if (uVar26 < uVar12) {
        uVar13 = uVar26;
      }
    }
    uVar12 = uVar19 + lVar16 + uVar10 * 2;
    local_c8 = local_c8 + 1;
    for (; uVar13 < uVar26; uVar13 = uVar13 + 1) {
      *(int *)(hasher + (ulong)((uint)((ulong)(*(long *)(ringbuffer + (uVar13 & ringbuffer_mask)) *
                                              0x35a7bd1e35a7bd00) >> 0x2c) +
                               ((uint)(uVar13 >> 3) & 3)) * 4 + 0x28) = (int)uVar13;
    }
    local_d0 = 0;
  } while( true );
  lVar11 = lVar11 + -8;
  uVar25 = uVar25 + 1;
  goto LAB_00109e4b;
code_r0x00109f4e:
  lVar11 = lVar11 + -8;
  uVar34 = uVar34 + 1;
  goto LAB_00109f3c;
code_r0x0010a1af:
  lVar11 = lVar11 + -8;
  uVar34 = uVar34 + 1;
  goto LAB_0010a197;
code_r0x0010a279:
  lVar11 = lVar11 + -8;
  uVar17 = uVar17 + 1;
  goto LAB_0010a265;
}

Assistant:

static BROTLI_NOINLINE void EXPORT_FN(CreateBackwardReferences)(
    size_t num_bytes, size_t position,
    const uint8_t* ringbuffer, size_t ringbuffer_mask,
    const BrotliEncoderParams* params, HasherHandle hasher, int* dist_cache,
    size_t* last_insert_len, Command* commands, size_t* num_commands,
    size_t* num_literals) {
  /* Set maximum distance, see section 9.1. of the spec. */
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);

  const Command* const orig_commands = commands;
  size_t insert_length = *last_insert_len;
  const size_t pos_end = position + num_bytes;
  const size_t store_end = num_bytes >= FN(StoreLookahead)() ?
      position + num_bytes - FN(StoreLookahead)() + 1 : position;

  /* For speed up heuristics for random data. */
  const size_t random_heuristics_window_size =
      LiteralSpreeLengthForSparseSearch(params);
  size_t apply_random_heuristics = position + random_heuristics_window_size;
  const size_t gap = 0;

  /* Minimum score to accept a backward reference. */
  const score_t kMinScore = BROTLI_SCORE_BASE + 100;

  FN(PrepareDistanceCache)(hasher, dist_cache);

  while (position + FN(HashTypeLength)() < pos_end) {
    size_t max_length = pos_end - position;
    size_t max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
    HasherSearchResult sr;
    sr.len = 0;
    sr.len_code_delta = 0;
    sr.distance = 0;
    sr.score = kMinScore;
    FN(FindLongestMatch)(hasher, &params->dictionary,
                         ringbuffer, ringbuffer_mask, dist_cache, position,
                         max_length, max_distance, gap,
                         params->dist.max_distance, &sr);
    if (sr.score > kMinScore) {
      /* Found a match. Let's look for something even better ahead. */
      int delayed_backward_references_in_row = 0;
      --max_length;
      for (;; --max_length) {
        const score_t cost_diff_lazy = 175;
        HasherSearchResult sr2;
        sr2.len = params->quality < MIN_QUALITY_FOR_EXTENSIVE_REFERENCE_SEARCH ?
            BROTLI_MIN(size_t, sr.len - 1, max_length) : 0;
        sr2.len_code_delta = 0;
        sr2.distance = 0;
        sr2.score = kMinScore;
        max_distance = BROTLI_MIN(size_t, position + 1, max_backward_limit);
        FN(FindLongestMatch)(hasher, &params->dictionary,
            ringbuffer, ringbuffer_mask, dist_cache, position + 1, max_length,
            max_distance, gap, params->dist.max_distance, &sr2);
        if (sr2.score >= sr.score + cost_diff_lazy) {
          /* Ok, let's just write one byte for now and start a match from the
             next byte. */
          ++position;
          ++insert_length;
          sr = sr2;
          if (++delayed_backward_references_in_row < 4 &&
              position + FN(HashTypeLength)() < pos_end) {
            continue;
          }
        }
        break;
      }
      apply_random_heuristics =
          position + 2 * sr.len + random_heuristics_window_size;
      max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
      {
        /* The first 16 codes are special short-codes,
           and the minimum offset is 1. */
        size_t distance_code =
            ComputeDistanceCode(sr.distance, max_distance + gap, dist_cache);
        if ((sr.distance <= (max_distance + gap)) && distance_code > 0) {
          dist_cache[3] = dist_cache[2];
          dist_cache[2] = dist_cache[1];
          dist_cache[1] = dist_cache[0];
          dist_cache[0] = (int)sr.distance;
          FN(PrepareDistanceCache)(hasher, dist_cache);
        }
        InitCommand(commands++, &params->dist, insert_length,
            sr.len, sr.len_code_delta, distance_code);
      }
      *num_literals += insert_length;
      insert_length = 0;
      /* Put the hash keys into the table, if there are enough bytes left.
         Depending on the hasher implementation, it can push all positions
         in the given range or only a subset of them.
         Avoid hash poisoning with RLE data. */
      {
        size_t range_start = position + 2;
        size_t range_end = BROTLI_MIN(size_t, position + sr.len, store_end);
        if (sr.distance < (sr.len >> 2)) {
          range_start = BROTLI_MIN(size_t, range_end, BROTLI_MAX(size_t,
              range_start, position + sr.len - (sr.distance << 2)));
        }
        FN(StoreRange)(hasher, ringbuffer, ringbuffer_mask, range_start,
                       range_end);
      }
      position += sr.len;
    } else {
      ++insert_length;
      ++position;
      /* If we have not seen matches for a long time, we can skip some
         match lookups. Unsuccessful match lookups are very very expensive
         and this kind of a heuristic speeds up compression quite
         a lot. */
      if (position > apply_random_heuristics) {
        /* Going through uncompressible data, jump. */
        if (position >
            apply_random_heuristics + 4 * random_heuristics_window_size) {
          /* It is quite a long time since we saw a copy, so we assume
             that this data is not compressible, and store hashes less
             often. Hashes of non compressible data are less likely to
             turn out to be useful in the future, too, so we store less of
             them to not to flood out the hash table of good compressible
             data. */
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 4);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 16, pos_end - kMargin);
          for (; position < pos_jump; position += 4) {
            FN(Store)(hasher, ringbuffer, ringbuffer_mask, position);
            insert_length += 4;
          }
        } else {
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 2);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 8, pos_end - kMargin);
          for (; position < pos_jump; position += 2) {
            FN(Store)(hasher, ringbuffer, ringbuffer_mask, position);
            insert_length += 2;
          }
        }
      }
    }
  }
  insert_length += pos_end - position;
  *last_insert_len = insert_length;
  *num_commands += (size_t)(commands - orig_commands);
}